

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_PostScript.cxx
# Opt level: O3

void __thiscall
Fl_PostScript_Graphics_Driver::line_style
          (Fl_PostScript_Graphics_Driver *this,int style,int width,char *dashes)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  char *pcVar6;
  int *piVar7;
  double *pdVar8;
  double dVar9;
  
  this->linewidth_ = width;
  this->linestyle_ = style;
  pcVar6 = this->linedash_;
  if (dashes == (char *)0x0) {
    *pcVar6 = '\0';
  }
  else if (pcVar6 != dashes) {
    strcpy(pcVar6,dashes);
  }
  uVar5 = width + (uint)(width == 0);
  fprintf((FILE *)this->output,"%i setlinewidth\n",(ulong)uVar5);
  if (style == 0) {
    style = 0;
    if (dashes == (char *)0x0) {
      if (width != 0) goto LAB_002035a9;
    }
    else {
      style = 0;
      if ((width != 0) || (*dashes != '\0')) goto LAB_002035a9;
    }
    style = 0x300;
  }
LAB_002035a9:
  uVar2 = (uint)style >> 8 & 0xf;
  uVar4 = (ulong)(uVar2 - 1);
  if (uVar2 == 0) {
    uVar4 = 0;
  }
  fprintf((FILE *)this->output,"%i setlinecap\n",uVar4);
  uVar2 = (uint)style >> 0xc & 0xf;
  uVar4 = (ulong)(uVar2 - 1);
  if (uVar2 == 0) {
    uVar4 = 0;
  }
  fprintf((FILE *)this->output,"%i setlinejoin\n",uVar4);
  fputc(0x5b,(FILE *)this->output);
  if ((dashes == (char *)0x0) || (cVar1 = *dashes, cVar1 == '\0')) {
    uVar2 = style & 0xff;
    if (((uint)style >> 9 & 1) == 0) {
      iVar3 = dashes_flat[uVar2][0];
      if (-1 < iVar3) {
        piVar7 = dashes_flat[uVar2];
        do {
          piVar7 = piVar7 + 1;
          fprintf((FILE *)this->output,"%i ",(ulong)(iVar3 * uVar5));
          iVar3 = *piVar7;
        } while (-1 < iVar3);
      }
    }
    else {
      dVar9 = dashes_cap[uVar2][0];
      if (0.0 <= dVar9) {
        pdVar8 = dashes_cap[uVar2];
        do {
          pdVar8 = pdVar8 + 1;
          clocale_printf(this,"%g ",dVar9 * (double)(int)uVar5);
          dVar9 = *pdVar8;
        } while (0.0 <= dVar9);
      }
    }
  }
  else {
    pcVar6 = dashes + 1;
    do {
      fprintf((FILE *)this->output,"%i ",(ulong)(uint)(int)cVar1);
      cVar1 = *pcVar6;
      pcVar6 = pcVar6 + 1;
    } while (cVar1 != '\0');
  }
  fwrite("] 0 setdash\n",0xc,1,(FILE *)this->output);
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::line_style(int style, int width, char* dashes){
  //line_styled_=1;
  
  linewidth_=width;
  linestyle_=style;
  //dashes_= dashes;
  if(dashes){
    if(dashes != linedash_)
      strcpy(linedash_,dashes);
    
  }else
    linedash_[0]=0;
  char width0 = 0;
  if(!width){
    width=1; //for screen drawing compatibility
    width0=1;
  }
  
  fprintf(output, "%i setlinewidth\n", width);
  
  if(!style && (!dashes || !(*dashes)) && width0) //system lines
    style = FL_CAP_SQUARE;
  
  int cap = (style &0xf00) >> 8;
  if(cap) cap--;
  fprintf(output,"%i setlinecap\n", cap);
  
  int join = (style & 0xf000) >> 12;
  
  if(join) join--;
  fprintf(output,"%i setlinejoin\n", join);
  
  
  fprintf(output, "[");
  if(dashes && *dashes){
    while(*dashes){
      fprintf(output, "%i ", *dashes);
      dashes++;
    }
  }else{
    if(style & 0x200){ // round and square caps, dash length need to be adjusted
      const double *dt = dashes_cap[style & 0xff];
      while (*dt >= 0){
        clocale_printf("%g ",width * (*dt));
        dt++;
      }
    }else{
      
      const int *ds = dashes_flat[style & 0xff];
      while (*ds >= 0){
	fprintf(output, "%i ",width * (*ds));
        ds++;
      }
    }
  }
  fprintf(output, "] 0 setdash\n");
}